

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O3

void __thiscall QNetworkCookie::setSameSitePolicy(QNetworkCookie *this,SameSite sameSite)

{
  QNetworkCookiePrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QNetworkCookiePrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  pQVar1->sameSite = sameSite;
  return;
}

Assistant:

void QNetworkCookie::setSameSitePolicy(QNetworkCookie::SameSite sameSite)
{
    d->sameSite = sameSite;
}